

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void AddArgsToScope(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,bool assignLocation)

{
  ParseNode *this;
  code *pcVar1;
  anon_class_32_4_343c1aa9 handler;
  anon_class_32_4_343c1aa9 handler_00;
  ByteCodeGenerator **ppBVar2;
  ArgSlot *pAVar3;
  bool *pbVar4;
  char cVar5;
  bool bVar6;
  FuncInfo *pFVar7;
  undefined4 *puVar8;
  ParseNodePtr pPVar9;
  ParseNodeParamPattern *pPVar10;
  undefined1 auStack_78 [8];
  anon_class_32_4_343c1aa9 addArgToScope;
  ByteCodeGenerator *local_30;
  ByteCodeGenerator *byteCodeGenerator_local;
  bool isNonSimpleParameterList;
  ArgSlot pos;
  bool assignLocation_local;
  
  local_30 = byteCodeGenerator;
  byteCodeGenerator_local._7_1_ = assignLocation;
  pFVar7 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  if (pFVar7->varRegsCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x901,"(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0)",
                       "byteCodeGenerator->TopFuncInfo()->varRegsCount == 0");
    if (!bVar6) goto LAB_0077f0f0;
    *puVar8 = 0;
  }
  addArgToScope.byteCodeGenerator = (ByteCodeGenerator **)((long)&byteCodeGenerator_local + 4);
  byteCodeGenerator_local._4_2_ = 1;
  byteCodeGenerator_local._3_1_ = (byte)(pnodeFnc->fncFlags >> 0xf) & 1;
  addArgToScope.pos = (ArgSlot *)((long)&byteCodeGenerator_local + 3);
  auStack_78 = (undefined1  [8])&local_30;
  addArgToScope.isNonSimpleParameterList = (bool *)((long)&byteCodeGenerator_local + 7);
  for (pPVar9 = pnodeFnc->pnodeParams; pPVar9 != (ParseNode *)0x0;
      pPVar9 = ParseNode::GetFormalNext(pPVar9)) {
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()
              ((anon_class_32_4_343c1aa9 *)auStack_78,pPVar9);
  }
  ByteCodeGenerator::SetNumberOfInArgs(local_30,byteCodeGenerator_local._4_2_);
  cVar5 = byteCodeGenerator_local._7_1_;
  if (pnodeFnc->pnodeRest != (ParseNode *)0x0) {
    byteCodeGenerator_local._7_1_ = 1;
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()
              ((anon_class_32_4_343c1aa9 *)auStack_78,pnodeFnc->pnodeRest);
  }
  pbVar4 = addArgToScope.isNonSimpleParameterList;
  pAVar3 = addArgToScope.pos;
  ppBVar2 = addArgToScope.byteCodeGenerator;
  addArgToScope.assignLocation = (bool *)auStack_78;
  byteCodeGenerator_local._7_1_ = cVar5;
  for (pPVar9 = pnodeFnc->pnodeParams; pPVar9 != (ParseNode *)0x0;
      pPVar9 = ParseNode::GetFormalNext(pPVar9)) {
    if (pPVar9->nop == knopParamPattern) {
      pPVar10 = ParseNode::AsParseNodeParamPattern(pPVar9);
      handler.pos = (ArgSlot *)ppBVar2;
      handler.byteCodeGenerator = (ByteCodeGenerator **)addArgToScope.assignLocation;
      handler.isNonSimpleParameterList = (bool *)pAVar3;
      handler.assignLocation = pbVar4;
      Parser::MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                ((pPVar10->super_ParseNodeUni).pnode1,handler);
    }
  }
  this = pnodeFnc->pnodeRest;
  if ((this != (ParseNode *)0x0) && (this->nop == knopParamPattern)) {
    pPVar10 = ParseNode::AsParseNodeParamPattern(this);
    handler_00.pos = (ArgSlot *)ppBVar2;
    handler_00.byteCodeGenerator = (ByteCodeGenerator **)addArgToScope.assignLocation;
    handler_00.isNonSimpleParameterList = (bool *)pAVar3;
    handler_00.assignLocation = pbVar4;
    Parser::MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
              ((pPVar10->super_ParseNodeUni).pnode1,handler_00);
  }
  if (byteCodeGenerator_local._7_1_ == '\x01') {
    pFVar7 = ByteCodeGenerator::TopFuncInfo(local_30);
    if (pFVar7->varRegsCount + 1 != (uint)byteCodeGenerator_local._4_2_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x93b,
                         "(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos)"
                         ,
                         "!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos"
                        );
      if (!bVar6) {
LAB_0077f0f0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
  }
  return;
}

Assistant:

void AddArgsToScope(ParseNodeFnc * pnodeFnc, ByteCodeGenerator *byteCodeGenerator, bool assignLocation)
{
    Assert(byteCodeGenerator->TopFuncInfo()->varRegsCount == 0);
    Js::ArgSlot pos = 1;
    bool isNonSimpleParameterList = pnodeFnc->HasNonSimpleParameterList();

    auto addArgToScope = [&](ParseNode *arg)
    {
        if (arg->IsVarLetOrConst())
        {
            ParseNodeVar * pnodeVarArg = arg->AsParseNodeVar();
            Symbol *formal = byteCodeGenerator->AddSymbolToScope(byteCodeGenerator->TopFuncInfo()->GetParamScope(),
                reinterpret_cast<const char16*>(pnodeVarArg->pid->Psz()),
                pnodeVarArg->pid->Cch(),
                pnodeVarArg,
                STFormal);
#if DBG_DUMP
            if (byteCodeGenerator->Trace())
            {
                Output::Print(_u("current context has declared arg %s of type %s at position %d\n"), arg->AsParseNodeVar()->pid->Psz(), formal->GetSymbolTypeName(), pos);
            }
#endif

            if (isNonSimpleParameterList)
            {
                formal->SetIsNonSimpleParameter(true);
            }

            pnodeVarArg->sym = formal;
            MarkFormal(byteCodeGenerator, formal, assignLocation || isNonSimpleParameterList, isNonSimpleParameterList);
        }
        else if (arg->nop == knopParamPattern)
        {
            arg->AsParseNodeParamPattern()->location = byteCodeGenerator->NextVarRegister();
        }
        else
        {
            Assert(false);
        }
        ArgSlotMath::Inc(pos);
    };

    // We process rest separately because the number of in args needs to exclude rest.
    MapFormalsWithoutRest(pnodeFnc, addArgToScope);
    byteCodeGenerator->SetNumberOfInArgs(pos);

    if (pnodeFnc->pnodeRest != nullptr)
    {
        // The rest parameter will always be in a register, regardless of whether it is in a scope slot.
        // We save the assignLocation value for the assert condition below.
        bool assignLocationSave = assignLocation;
        assignLocation = true;

        addArgToScope(pnodeFnc->pnodeRest);

        assignLocation = assignLocationSave;
    }

    MapFormalsFromPattern(pnodeFnc, addArgToScope);

    Assert(!assignLocation || byteCodeGenerator->TopFuncInfo()->varRegsCount + 1 == pos);
}